

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 2_variable_reference.cpp
# Opt level: O2

dota_record * accumulate(dota_record *target,dota_record *source)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  
  uVar1 = source->played;
  uVar3 = source->win;
  uVar2 = target->played;
  uVar4 = target->win;
  target->played = uVar2 + uVar1;
  target->win = uVar4 + uVar3;
  update_record(target);
  return target;
}

Assistant:

dota_record & accumulate(dota_record & target, const dota_record & source) {
    //  first param is not const, so we can modify it.
    target.played += source.played;
    target.win += source.win;
    update_record(target);
    return target;
}